

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int64_t test_string_compare(char *a,char *b)

{
  char cVar1;
  long lVar2;
  char cVar3;
  
  if (a == b) {
    return 0;
  }
  if (a != (char *)0x0) {
    if (b == (char *)0x0) {
      return 1;
    }
    cVar1 = *a;
    cVar3 = *b;
    if (cVar1 == cVar3) {
      lVar2 = 1;
      do {
        if (cVar1 == '\0') {
          return 0;
        }
        cVar1 = a[lVar2];
        cVar3 = b[lVar2];
        lVar2 = lVar2 + 1;
      } while (cVar1 == cVar3);
    }
    return (long)cVar1 - (long)cVar3;
  }
  return -1;
}

Assistant:

int64_t test_string_compare(const char *a, const char *b)
{
  if (a == b)
  {
    return 0;
  }
  if (a == nullptr)
  {
    return -1;
  }
  if (b == nullptr)
  {
    return +1;
  }

  for (;;)
  {
    if (*a != *b)
    {
      return *a - *b;
    }

    // We only need to check 'a' here since we already verified they are the
    // same above.
    if (*a == 0)
    {
      return 0;
    }

    ++a;
    ++b;
  }
}